

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O1

void __thiscall
amrex::EB2::
GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
::updateIntercept(GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                  *this,Array<Array4<Real>,_3> *inter_arr,Array<Array4<const_Type_t>,_3> *type_arr,
                 Array4<const_double> *lst,Geometry *geom)

{
  Array4<double> *pAVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  uint *puVar20;
  double *pdVar21;
  long lVar22;
  int idim;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  Array4<const_unsigned_int> *pAVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  bool bVar43;
  double dVar44;
  long local_a8;
  long local_88;
  long local_80;
  
  dVar2 = (geom->super_CoordSys).dx[0];
  dVar3 = (geom->super_CoordSys).dx[1];
  dVar4 = (geom->super_CoordSys).dx[2];
  dVar5 = (geom->prob_domain).xlo[0];
  dVar6 = (geom->prob_domain).xlo[1];
  dVar7 = (geom->prob_domain).xlo[2];
  lVar23 = 0;
  do {
    iVar10 = inter_arr->_M_elems[lVar23].begin.z;
    local_a8 = (long)iVar10;
    iVar11 = inter_arr->_M_elems[lVar23].end.z;
    if (iVar10 < iVar11) {
      pAVar1 = inter_arr->_M_elems + lVar23;
      pAVar27 = type_arr->_M_elems + lVar23;
      iVar10 = inter_arr->_M_elems[lVar23].end.x;
      iVar12 = inter_arr->_M_elems[lVar23].end.y;
      iVar13 = (pAVar1->begin).y;
      iVar14 = (pAVar1->begin).x;
      lVar30 = (long)iVar14;
      lVar29 = 0;
      local_88 = local_a8;
      do {
        local_88 = local_88 + 1;
        if (iVar13 < iVar12) {
          dVar39 = (double)(int)local_a8 * dVar4 + dVar7;
          dVar40 = (double)((int)local_a8 + 1) * dVar4 + dVar7;
          lVar38 = 0;
          lVar37 = (long)iVar13;
          local_80 = (long)iVar13;
          do {
            local_80 = local_80 + 1;
            if (iVar14 < iVar10) {
              iVar15 = (pAVar27->begin).x;
              iVar16 = (pAVar27->begin).y;
              iVar17 = (pAVar27->begin).z;
              lVar31 = (long)(lst->begin).y;
              lVar34 = (long)(lst->begin).z;
              lVar18 = pAVar27->kstride;
              lVar28 = lst->kstride * 8;
              lVar19 = pAVar27->jstride;
              lVar25 = (local_a8 - lVar34) * lVar28;
              puVar20 = pAVar27->p;
              lVar32 = lst->jstride * 8;
              lVar35 = (lVar37 - lVar31) * lVar32;
              lVar26 = (long)(lst->begin).x;
              dVar42 = (double)(int)lVar37 * dVar3 + dVar6;
              dVar41 = (double)((int)lVar37 + 1) * dVar3 + dVar6;
              pdVar21 = lst->p;
              lVar22 = lVar25 + lVar35 + lVar26 * -8 + lVar30 * 8;
              lVar33 = 0;
              do {
                if (puVar20[lVar30 + (((local_a8 - iVar17) * lVar18 +
                                      (lVar37 - iVar16) * lVar19 + lVar33) - (long)iVar15)] == 2) {
                  lVar36 = pAVar1->jstride * lVar38 + pAVar1->kstride * lVar29;
                  dVar8 = *(double *)((long)pAVar1->p + lVar33 * 8 + lVar36);
                  if ((int)lVar23 == 1) {
                    dVar9 = *(double *)((long)pdVar21 + lVar33 * 8 + lVar22);
                    dVar44 = dVar42;
                    if (((dVar9 != 0.0) || (NAN(dVar9))) && (dVar9 <= 0.0 || !NAN(dVar8))) {
                      dVar9 = *(double *)
                               ((long)pdVar21 +
                               lVar33 * 8 +
                               (local_80 - lVar31) * lVar32 + lVar25 + lVar26 * -8 + lVar30 * 8);
                      dVar44 = dVar41;
                      if ((dVar9 != 0.0) || (NAN(dVar9))) {
                        bVar43 = !NAN(dVar8) || dVar9 <= 0.0;
LAB_003251e1:
                        if (bVar43) goto LAB_00325208;
                      }
                    }
                  }
                  else if ((int)lVar23 == 0) {
                    dVar9 = *(double *)((long)pdVar21 + lVar33 * 8 + lVar22);
                    if (((dVar9 == 0.0) && (!NAN(dVar9))) || (0.0 < dVar9 && NAN(dVar8))) {
                      iVar24 = iVar14 + (int)lVar33;
                    }
                    else {
                      dVar9 = *(double *)((long)pdVar21 + lVar33 * 8 + lVar22 + 8);
                      if (((dVar9 != 0.0) || (NAN(dVar9))) && (!NAN(dVar8) || dVar9 <= 0.0))
                      goto LAB_00325208;
                      iVar24 = iVar14 + (int)lVar33 + 1;
                    }
                    dVar44 = (double)iVar24 * dVar2 + dVar5;
                  }
                  else {
                    dVar9 = *(double *)((long)pdVar21 + lVar33 * 8 + lVar22);
                    dVar44 = dVar39;
                    if (((dVar9 != 0.0) || (NAN(dVar9))) && (dVar9 <= 0.0 || !NAN(dVar8))) {
                      dVar9 = *(double *)
                               ((long)pdVar21 +
                               lVar33 * 8 +
                               (local_88 - lVar34) * lVar28 + lVar35 + lVar26 * -8 + lVar30 * 8);
                      dVar44 = dVar40;
                      if ((dVar9 != 0.0) || (NAN(dVar9))) {
                        bVar43 = !NAN(dVar8) || dVar9 <= 0.0;
                        goto LAB_003251e1;
                      }
                    }
                  }
                  *(double *)((long)pAVar1->p + lVar33 * 8 + lVar36) = dVar44;
                }
LAB_00325208:
                lVar33 = lVar33 + 1;
              } while (iVar10 - lVar30 != lVar33);
            }
            lVar37 = lVar37 + 1;
            lVar38 = lVar38 + 8;
          } while (lVar37 != iVar12);
        }
        local_a8 = local_a8 + 1;
        lVar29 = lVar29 + 8;
      } while (local_a8 != iVar11);
    }
    lVar23 = lVar23 + 1;
    if (lVar23 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void updateIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                          Array<Array4<Type_t const>,AMREX_SPACEDIM> const& type_arr,
                          Array4<Real const> const& lst, Geometry const& geom) const noexcept
    {
        auto const& dx = geom.CellSizeArray();
        auto const& problo = geom.ProbLoArray();
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            Array4<Real> const& inter = inter_arr[idim];
            Array4<Type_t const> const& type = type_arr[idim];
            const Box bx{inter};
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                if (type(i,j,k) == Type::irregular) {
                    bool is_nan = amrex::isnan(inter(i,j,k));
                    if (idim == 0) {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            // interp might still be quiet_nan because lst that
                            // was set to zero has been changed by FillBoundary
                            // at periodic bounadries.
                            inter(i,j,k) = problo[0] + i*dx[0];
                        }
                        else if (lst(i+1,j,k) == Real(0.0) ||
                                 (lst(i+1,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[0] + (i+1)*dx[0];
                        }
                    } else if (idim == 1) {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[1] + j*dx[1];
                        }
                        else if (lst(i,j+1,k) == Real(0.0) ||
                                 (lst(i,j+1,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[1] + (j+1)*dx[1];
                        }
                    } else {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[2] + k*dx[2];
                        }
                        else if (lst(i,j,k+1) == Real(0.0) ||
                                 (lst(i,j,k+1) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[2] + (k+1)*dx[2];
                        }
                    }
                }
            });
        }
    }